

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# prim-types.hh
# Opt level: O0

RelationshipProperty * __thiscall
tinyusdz::RelationshipProperty::operator=(RelationshipProperty *this,RelationshipProperty *param_1)

{
  RelationshipProperty *param_1_local;
  RelationshipProperty *this_local;
  
  this->_authored = (bool)(param_1->_authored & 1);
  Relationship::operator=(&this->_relationship,&param_1->_relationship);
  return this;
}

Assistant:

RelationshipProperty() = default;